

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

Ptr<Image>
myvk::Image::Create(Ptr<Device> *device,VkImageCreateInfo *create_info,
                   VmaAllocationCreateFlags allocation_flags,VmaMemoryUsage memory_usage,
                   vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                   *access_queues)

{
  VkImageUsageFlags VVar1;
  VkImageType VVar2;
  VkFormat VVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  _Rb_tree_const_iterator<unsigned_int> __first;
  void *pvVar6;
  bool bVar7;
  VkResult VVar8;
  element_type *peVar9;
  size_type sVar10;
  element_type *this;
  undefined4 in_ECX;
  void *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar11;
  Ptr<Image> PVar12;
  VmaAllocationCreateInfo alloc_info;
  VkImageCreateInfo new_info;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queue_families;
  shared_ptr<myvk::Queue> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *__range1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> queue_family_set;
  shared_ptr<myvk::Image> ret;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffe08;
  shared_ptr<myvk::Device> *in_stack_fffffffffffffe10;
  shared_ptr<myvk::Image> *this_00;
  undefined4 in_stack_fffffffffffffe20;
  value_type_conflict2 *in_stack_fffffffffffffe28;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffe30;
  allocator_type *__a;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  _Rb_tree_const_iterator<unsigned_int> in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  uint32_t in_stack_fffffffffffffe54;
  VmaAllocationInfo *pAllocationInfo;
  VmaAllocation *pAllocation;
  VkImage *pImage;
  VmaAllocationCreateInfo *pAllocationCreateInfo;
  VkImageCreateInfo *pImageCreateInfo;
  VmaAllocator allocator;
  undefined1 local_138 [60];
  undefined4 local_fc;
  undefined4 local_f8;
  uint *local_f0;
  allocator_type local_d9;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  uint32_t local_8c;
  reference local_88;
  shared_ptr<myvk::Queue> *local_80;
  __normal_iterator<const_std::shared_ptr<myvk::Queue>_*,_std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>_>
  local_78;
  undefined8 local_70;
  shared_ptr<myvk::Image> local_38;
  undefined8 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  void *local_18;
  
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::make_shared<myvk::Image>();
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x2a6faa)
  ;
  std::shared_ptr<myvk::Device>::operator=
            (in_stack_fffffffffffffe10,(shared_ptr<myvk::Device> *)in_stack_fffffffffffffe08);
  VVar1 = *(VkImageUsageFlags *)((long)local_18 + 0x38);
  peVar9 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x2a6fd7);
  pvVar6 = local_18;
  (peVar9->super_ImageBase).m_usage = VVar1;
  peVar9 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x2a6ff8);
  uVar5 = *(undefined8 *)((long)pvVar6 + 0x1c);
  (peVar9->super_ImageBase).m_extent.width = (int)uVar5;
  (peVar9->super_ImageBase).m_extent.height = (int)((ulong)uVar5 >> 0x20);
  (peVar9->super_ImageBase).m_extent.depth = *(uint32_t *)((long)pvVar6 + 0x24);
  VVar2 = *(VkImageType *)((long)local_18 + 0x14);
  peVar9 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x2a7027);
  (peVar9->super_ImageBase).m_type = VVar2;
  VVar3 = *(VkFormat *)((long)local_18 + 0x18);
  peVar9 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x2a704d);
  (peVar9->super_ImageBase).m_format = VVar3;
  uVar4 = *(uint32_t *)((long)local_18 + 0x28);
  peVar9 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x2a7076);
  (peVar9->super_ImageBase).m_mip_levels = uVar4;
  uVar4 = *(uint32_t *)((long)local_18 + 0x2c);
  peVar9 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x2a709f);
  (peVar9->super_ImageBase).m_array_layers = uVar4;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x2a70b6);
  local_70 = local_28;
  local_78._M_current =
       (shared_ptr<myvk::Queue> *)
       std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
       begin((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffe08);
  local_80 = (shared_ptr<myvk::Queue> *)
             std::
             vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
             end((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                  *)in_stack_fffffffffffffe08);
  while( true ) {
    bVar7 = __gnu_cxx::
            operator==<const_std::shared_ptr<myvk::Queue>_*,_std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>_>
                      ((__normal_iterator<const_std::shared_ptr<myvk::Queue>_*,_std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>_>
                        *)in_stack_fffffffffffffe10,
                       (__normal_iterator<const_std::shared_ptr<myvk::Queue>_*,_std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>_>
                        *)in_stack_fffffffffffffe08);
    if (((bVar7 ^ 0xffU) & 1) == 0) break;
    local_88 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<myvk::Queue>_*,_std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>_>
               ::operator*(&local_78);
    std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a7132);
    in_stack_fffffffffffffe54 = Queue::GetFamilyIndex((Queue *)0x2a713a);
    local_8c = in_stack_fffffffffffffe54;
    pVar11 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                       (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe48 = pVar11.first._M_node;
    in_stack_fffffffffffffe47 = pVar11.second;
    local_b0 = in_stack_fffffffffffffe48._M_node;
    local_a8 = in_stack_fffffffffffffe47;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<myvk::Queue>_*,_std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>_>
    ::operator++(&local_78);
  }
  local_d0 = (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (in_stack_fffffffffffffe08);
  local_d8 = (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       (in_stack_fffffffffffffe08);
  __a = &local_d9;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2a71ec);
  __first._M_node._4_4_ = in_stack_fffffffffffffe54;
  __first._M_node._0_4_ = in_stack_fffffffffffffe50;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),__first,
             in_stack_fffffffffffffe48,__a);
  std::allocator<unsigned_int>::~allocator(&local_d9);
  memcpy(local_138,local_18,0x58);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_c8);
  if (sVar10 < 2) {
    local_fc = 0;
  }
  else {
    local_fc = 1;
    sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_c8);
    local_f8 = (undefined4)sVar10;
    local_f0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2a72a9);
  }
  pImageCreateInfo = (VkImageCreateInfo *)0x0;
  allocator = (VmaAllocator)0x0;
  pImage = (VkImage *)0x0;
  pAllocationCreateInfo = (VmaAllocationCreateInfo *)0x0;
  pAllocation = (VmaAllocation *)0x0;
  pAllocationInfo = (VmaAllocationInfo *)CONCAT44(local_20,local_1c);
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x2a72f5);
  Device::GetAllocatorHandle(this);
  this_00 = &local_38;
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x2a7316)
  ;
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x2a7329)
  ;
  VVar8 = vmaCreateImage(allocator,pImageCreateInfo,pAllocationCreateInfo,pImage,pAllocation,
                         pAllocationInfo);
  if (VVar8 == VK_SUCCESS) {
    std::shared_ptr<myvk::Image>::shared_ptr
              (this_00,(shared_ptr<myvk::Image> *)in_stack_fffffffffffffe08);
  }
  else {
    std::shared_ptr<myvk::Image>::shared_ptr(this_00,in_stack_fffffffffffffe08);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(VVar8,in_stack_fffffffffffffe20));
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x2a73d8);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x2a73e5);
  PVar12.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar12.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Image>)PVar12.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Image> Image::Create(const Ptr<Device> &device, const VkImageCreateInfo &create_info,
                         VmaAllocationCreateFlags allocation_flags, VmaMemoryUsage memory_usage,
                         const std::vector<Ptr<Queue>> &access_queues) {
	auto ret = std::make_shared<Image>();
	ret->m_device_ptr = device;

	ret->m_usage = create_info.usage;
	ret->m_extent = create_info.extent;
	ret->m_type = create_info.imageType;
	ret->m_format = create_info.format;
	ret->m_mip_levels = create_info.mipLevels;
	ret->m_array_layers = create_info.arrayLayers;

	std::set<uint32_t> queue_family_set;
	for (auto &i : access_queues)
		queue_family_set.insert(i->GetFamilyIndex());
	std::vector<uint32_t> queue_families{queue_family_set.begin(), queue_family_set.end()};

	VkImageCreateInfo new_info{create_info};
	if (queue_families.size() <= 1) {
		new_info.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
	} else {
		new_info.sharingMode = VK_SHARING_MODE_CONCURRENT;
		new_info.queueFamilyIndexCount = queue_families.size();
		new_info.pQueueFamilyIndices = queue_families.data();
	}

	VmaAllocationCreateInfo alloc_info = {};
	alloc_info.flags = allocation_flags;
	alloc_info.usage = memory_usage;

	if (vmaCreateImage(device->GetAllocatorHandle(), &new_info, &alloc_info, &ret->m_image, &ret->m_allocation,
	                   nullptr) != VK_SUCCESS)
		return nullptr;
	return ret;
}